

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cast.h
# Opt level: O0

handle pybind11::detail::type_caster<char,_void>::cast
                 (char *src,return_value_policy policy,handle parent)

{
  PyObject *in_RDX;
  char *in_RDI;
  object *in_stack_ffffffffffffff68;
  none *in_stack_ffffffffffffff80;
  allocator *paVar1;
  undefined8 in_stack_ffffffffffffff88;
  return_value_policy rVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff90;
  allocator local_59;
  string local_58 [72];
  handle local_10;
  PyObject *local_8;
  
  rVar2 = (return_value_policy)((ulong)in_stack_ffffffffffffff88 >> 0x38);
  if (in_RDI == (char *)0x0) {
    none::none(in_stack_ffffffffffffff80);
    local_8 = (PyObject *)object::release(in_stack_ffffffffffffff68);
    none::~none((none *)0x1335c0);
  }
  else {
    paVar1 = &local_59;
    local_10.m_ptr = in_RDX;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_58,in_RDI,paVar1);
    local_8 = (PyObject *)
              string_caster<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
              ::cast(in_stack_ffffffffffffff90,rVar2,local_10);
    std::__cxx11::string::~string(local_58);
    std::allocator<char>::~allocator((allocator<char> *)&local_59);
  }
  return (handle)local_8;
}

Assistant:

static handle cast(const CharT *src, return_value_policy policy, handle parent) {
        if (src == nullptr) {
            return pybind11::none().release();
        }
        return StringCaster::cast(StringType(src), policy, parent);
    }